

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencySymbols::CurrencySymbols
          (CurrencySymbols *this,CurrencyUnit *currency,Locale *locale,DecimalFormatSymbols *symbols
          ,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  CurrencyUnit local_50;
  UErrorCode *local_30;
  UErrorCode *status_local;
  DecimalFormatSymbols *symbols_local;
  Locale *locale_local;
  CurrencyUnit *currency_local;
  CurrencySymbols *this_local;
  
  local_30 = status;
  status_local = (UErrorCode *)symbols;
  symbols_local = (DecimalFormatSymbols *)locale;
  locale_local = (Locale *)currency;
  currency_local = (CurrencyUnit *)this;
  CurrencyUnit::CurrencyUnit(&local_50,currency);
  CurrencySymbols(this,&local_50,(Locale *)symbols_local,local_30);
  CurrencyUnit::~CurrencyUnit(&local_50);
  UVar1 = DecimalFormatSymbols::isCustomCurrencySymbol((DecimalFormatSymbols *)status_local);
  if (UVar1 != '\0') {
    pUVar2 = DecimalFormatSymbols::getConstSymbol
                       ((DecimalFormatSymbols *)status_local,kCurrencySymbol);
    icu_63::UnicodeString::operator=(&this->fCurrencySymbol,pUVar2);
  }
  UVar1 = DecimalFormatSymbols::isCustomIntlCurrencySymbol((DecimalFormatSymbols *)status_local);
  if (UVar1 != '\0') {
    pUVar2 = DecimalFormatSymbols::getConstSymbol
                       ((DecimalFormatSymbols *)status_local,kIntlCurrencySymbol);
    icu_63::UnicodeString::operator=(&this->fIntlCurrencySymbol,pUVar2);
  }
  return;
}

Assistant:

CurrencySymbols::CurrencySymbols(CurrencyUnit currency, const Locale& locale,
                                 const DecimalFormatSymbols& symbols, UErrorCode& status)
        : CurrencySymbols(currency, locale, status) {
    // If either of the overrides is present, save it in the local UnicodeString.
    if (symbols.isCustomCurrencySymbol()) {
        fCurrencySymbol = symbols.getConstSymbol(DecimalFormatSymbols::kCurrencySymbol);
    }
    if (symbols.isCustomIntlCurrencySymbol()) {
        fIntlCurrencySymbol = symbols.getConstSymbol(DecimalFormatSymbols::kIntlCurrencySymbol);
    }
}